

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O3

void soul::CallFlowGraph::iterateCallSequences
               (Function *f,CallSequenceCheckResults *results,PreviousCall *previous,
               uint64_t stackSize)

{
  pointer ppVar1;
  PreviousCall **ppPVar2;
  ulong uVar3;
  PreviousCall *pPVar4;
  long lVar5;
  Statement *pSVar6;
  pointer ppVar7;
  ulong stackSize_00;
  PreviousCall newPrevious;
  PreviousCall local_40;
  
  calculateLocalVariableStackSize(f);
  stackSize_00 = stackSize + f->localVariableStackSize + 0x10;
  uVar3 = results->maximumStackSize;
  if (results->maximumStackSize <= stackSize_00) {
    uVar3 = stackSize_00;
  }
  results->maximumStackSize = uVar3;
  pPVar4 = previous;
  local_40.previous = previous;
  local_40.function = f;
  if (previous != (PreviousCall *)0x0) {
    do {
      if (pPVar4->function == f) {
        if ((results->recursiveFunctionCallSequence).
            super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (results->recursiveFunctionCallSequence).
            super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          return;
        }
        PreviousCall::findCallSequenceUpTo(previous,f,&results->recursiveFunctionCallSequence);
        return;
      }
      ppPVar2 = &pPVar4->previous;
      pPVar4 = *ppPVar2;
    } while (*ppPVar2 != (PreviousCall *)0x0);
  }
  ppVar7 = (f->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (f->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar7 == ppVar1) {
      return;
    }
    for (pSVar6 = (ppVar7->object->statements).firstObject; pSVar6 != (Statement *)0x0;
        pSVar6 = pSVar6->nextObject) {
      lVar5 = __dynamic_cast(pSVar6,&heart::Statement::typeinfo,&heart::FunctionCall::typeinfo,0);
      if (lVar5 != 0) {
        if (*(Function **)(lVar5 + 0x28) == (Function *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        iterateCallSequences(*(Function **)(lVar5 + 0x28),results,&local_40,stackSize_00);
      }
    }
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

static void iterateCallSequences (heart::Function& f,
                                      CallSequenceCheckResults& results,
                                      PreviousCall* previous,
                                      uint64_t stackSize)
    {
        calculateLocalVariableStackSize (f);
        stackSize += perCallStackOverhead + f.localVariableStackSize;
        results.maximumStackSize = std::max (results.maximumStackSize, stackSize);

        PreviousCall newPrevious { previous, f };

        if (previous != nullptr && previous->contains (f))
        {
            if (results.recursiveFunctionCallSequence.empty())
                previous->findCallSequenceUpTo (f, results.recursiveFunctionCallSequence);

            return;
        }

        for (auto& b : f.blocks)
            for (auto s : b->statements)
                if (auto call = cast<heart::FunctionCall> (*s))
                    iterateCallSequences (call->getFunction(), results, std::addressof (newPrevious), stackSize);
    }